

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O3

bool tinyusdz::WriteMaterialXToString(MtlxModel *mtlx,string *xml_str,string *warn,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  MtlxUsdPreviewSurface *pMVar3;
  ostream *poVar4;
  MtlxAutodeskStandardSurface *pMVar5;
  ostringstream *this;
  uint32_t n;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar6;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t extraout_EDX_20;
  uint32_t extraout_EDX_21;
  uint32_t extraout_EDX_22;
  uint32_t extraout_EDX_23;
  uint32_t extraout_EDX_24;
  uint32_t extraout_EDX_25;
  uint32_t extraout_EDX_26;
  uint32_t extraout_EDX_27;
  uint32_t extraout_EDX_28;
  uint32_t extraout_EDX_29;
  uint32_t extraout_EDX_30;
  uint32_t extraout_EDX_31;
  uint32_t extraout_EDX_32;
  uint32_t extraout_EDX_33;
  uint32_t extraout_EDX_34;
  uint32_t extraout_EDX_35;
  string value_str;
  string node_name;
  size_type __dnew;
  stringstream ss;
  string local_230;
  string *local_210;
  string local_208;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  undefined2 local_1d0;
  undefined1 local_1ce;
  string *local_1c8;
  size_type local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [96];
  ios_base local_148 [16];
  ios_base local_138 [264];
  
  pMVar3 = value::Value::as<tinyusdz::MtlxUsdPreviewSurface>(&mtlx->shader,false);
  if (pMVar3 == (MtlxUsdPreviewSurface *)0x0) {
    pMVar5 = value::Value::as<tinyusdz::MtlxAutodeskStandardSurface>(&mtlx->shader,false);
    this = (ostringstream *)local_1b8;
    if (pMVar5 == (MtlxAutodeskStandardSurface *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream(this);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"WriteMaterialXToString",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(this,0x3a3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"Unknown/unsupported shader: ",0x1c);
      this = (ostringstream *)
             ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this,(mtlx->shader_name)._M_dataplus._M_p,
                        (mtlx->shader_name)._M_string_length);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(this);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"WriteMaterialXToString",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(this,0x3a0);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"TODO: AutodeskStandardSurface",0x1d);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1e8);
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    ::std::ios_base::~ios_base(local_148);
    return false;
  }
  local_210 = err;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e8 = &local_1d8;
  local_1d8 = 0x75616665645f5253;
  local_1d0 = 0x746c;
  local_1e0 = 10;
  local_1ce = 0;
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"<?xml version=\"1.0\"?>\n",0x16);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"<materialx version=\"1.38\" colorspace=\"lin_rec709\">\n",0x33);
  pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x1,n);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<UsdPreviewSurface name=\"",0x19);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1e8,local_1e0);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type =\"surfaceshader\">\n",0x19);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_208.field_2;
  local_208.field_2._M_allocated_capacity._0_4_ = 0x66666964;
  local_208.field_2._M_local_buf[4] = 'u';
  local_208.field_2._M_local_buf[5] = 's';
  local_208.field_2._M_local_buf[6] = 'e';
  local_208.field_2._M_local_buf[7] = 'C';
  local_208.field_2._M_local_buf[8] = 'o';
  local_208.field_2._M_local_buf[9] = 'l';
  local_208.field_2._10_2_ = 0x726f;
  local_208._M_string_length = 0xc;
  local_208.field_2._M_local_buf[0xc] = '\0';
  local_208._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = detail::SerializeAttribute<tinyusdz::value::color3f>
                    (&local_208,&(pMVar3->super_UsdPreviewSurface).diffuseColor,&local_230,local_210
                    );
  uVar6 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT17(local_208.field_2._M_local_buf[7],
                             CONCAT16(local_208.field_2._M_local_buf[6],
                                      CONCAT15(local_208.field_2._M_local_buf[5],
                                               CONCAT14(local_208.field_2._M_local_buf[4],
                                                        local_208.field_2._M_allocated_capacity.
                                                        _0_4_)))) + 1);
    uVar6 = extraout_EDX_00;
  }
  if (bVar2) {
    if (local_230._M_string_length != 0) {
      pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<input name=\"",0xd);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"diffuseColor",0xc);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"color3",6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT17(local_208.field_2._M_local_buf[7],
                                 CONCAT16(local_208.field_2._M_local_buf[6],
                                          CONCAT15(local_208.field_2._M_local_buf[5],
                                                   CONCAT14(local_208.field_2._M_local_buf[4],
                                                            local_208.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    local_230._M_string_length = 0;
    local_230.field_2._M_local_buf[0] = '\0';
    local_208.field_2._M_allocated_capacity._0_4_ = 0x73696d65;
    local_208.field_2._M_local_buf[4] = 's';
    local_208.field_2._M_local_buf[5] = 'i';
    local_208.field_2._M_local_buf[6] = 'v';
    local_208.field_2._M_local_buf[7] = 'e';
    local_208.field_2._M_local_buf[8] = 'C';
    local_208.field_2._M_local_buf[9] = 'o';
    local_208.field_2._10_2_ = 0x6f6c;
    local_208.field_2._M_local_buf[0xc] = 'r';
    local_208._M_string_length = 0xd;
    local_208.field_2._M_local_buf[0xd] = '\0';
    local_208._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = detail::SerializeAttribute<tinyusdz::value::color3f>
                      (&local_208,&(pMVar3->super_UsdPreviewSurface).emissiveColor,&local_230,
                       local_210);
    uVar6 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT17(local_208.field_2._M_local_buf[7],
                               CONCAT16(local_208.field_2._M_local_buf[6],
                                        CONCAT15(local_208.field_2._M_local_buf[5],
                                                 CONCAT14(local_208.field_2._M_local_buf[4],
                                                          local_208.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
      uVar6 = extraout_EDX_02;
    }
    if (bVar2) {
      if (local_230._M_string_length != 0) {
        pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<input name=\"",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"emissiveColor",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"color3",6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT17(local_208.field_2._M_local_buf[7],
                                   CONCAT16(local_208.field_2._M_local_buf[6],
                                            CONCAT15(local_208.field_2._M_local_buf[5],
                                                     CONCAT14(local_208.field_2._M_local_buf[4],
                                                              local_208.field_2.
                                                              _M_allocated_capacity._0_4_)))) + 1);
        }
      }
      local_1c8 = xml_str;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                 local_230.field_2._M_local_buf[0]) + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      local_230._M_string_length = 0;
      local_230.field_2._M_local_buf[0] = '\0';
      local_1c0 = 0x13;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      local_208._M_dataplus._M_p =
           (pointer)::std::__cxx11::string::_M_create((ulong *)&local_208,(ulong)&local_1c0);
      local_208.field_2._M_allocated_capacity._0_4_ = (undefined4)local_1c0;
      local_208.field_2._M_local_buf[4] = (char)(local_1c0 >> 0x20);
      local_208.field_2._M_local_buf[5] = (char)(local_1c0 >> 0x28);
      local_208.field_2._M_local_buf[6] = (char)(local_1c0 >> 0x30);
      local_208.field_2._M_local_buf[7] = (char)(local_1c0 >> 0x38);
      *(undefined8 *)local_208._M_dataplus._M_p = 0x7563657053657375;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 8) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 9) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 10) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 0xb) = 'W';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 0xc) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 0xd) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 0xe) = 'k';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 0xf) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 0xf) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 0x10) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 0x11) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p + 0x12) = 'w';
      local_208._M_string_length = local_1c0;
      local_208._M_dataplus._M_p[local_1c0] = '\0';
      bVar2 = detail::SerializeAttribute<int>
                        (&local_208,&(pMVar3->super_UsdPreviewSurface).useSpecularWorkflow,
                         &local_230,local_210);
      uVar6 = extraout_EDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT17(local_208.field_2._M_local_buf[7],
                                 CONCAT16(local_208.field_2._M_local_buf[6],
                                          CONCAT15(local_208.field_2._M_local_buf[5],
                                                   CONCAT14(local_208.field_2._M_local_buf[4],
                                                            local_208.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
        uVar6 = extraout_EDX_04;
      }
      if (bVar2) {
        if (local_230._M_string_length != 0) {
          pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<input name=\"",0xd);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"useSpecularWorkflow",0x13);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"integer",7);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT17(local_208.field_2._M_local_buf[7],
                                     CONCAT16(local_208.field_2._M_local_buf[6],
                                              CONCAT15(local_208.field_2._M_local_buf[5],
                                                       CONCAT14(local_208.field_2._M_local_buf[4],
                                                                local_208.field_2.
                                                                _M_allocated_capacity._0_4_)))) + 1)
            ;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,
                          CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                   local_230.field_2._M_local_buf[0]) + 1);
        }
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        local_230._M_string_length = 0;
        local_230.field_2._M_local_buf[0] = '\0';
        local_208.field_2._M_allocated_capacity._0_4_ = 0x63657073;
        local_208.field_2._M_local_buf[4] = 'u';
        local_208.field_2._M_local_buf[5] = 'l';
        local_208.field_2._M_local_buf[6] = 'a';
        local_208.field_2._M_local_buf[7] = 'r';
        local_208.field_2._M_local_buf[8] = 'C';
        local_208.field_2._M_local_buf[9] = 'o';
        local_208.field_2._10_2_ = 0x6f6c;
        local_208.field_2._M_local_buf[0xc] = 'r';
        local_208._M_string_length = 0xd;
        local_208.field_2._M_local_buf[0xd] = '\0';
        local_208._M_dataplus._M_p = (pointer)paVar1;
        bVar2 = detail::SerializeAttribute<tinyusdz::value::color3f>
                          (&local_208,&(pMVar3->super_UsdPreviewSurface).specularColor,&local_230,
                           local_210);
        uVar6 = extraout_EDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT17(local_208.field_2._M_local_buf[7],
                                   CONCAT16(local_208.field_2._M_local_buf[6],
                                            CONCAT15(local_208.field_2._M_local_buf[5],
                                                     CONCAT14(local_208.field_2._M_local_buf[4],
                                                              local_208.field_2.
                                                              _M_allocated_capacity._0_4_)))) + 1);
          uVar6 = extraout_EDX_06;
        }
        if (bVar2) {
          if (local_230._M_string_length != 0) {
            pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
            poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<input name=\"",0xd);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"specularColor",0xd);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"color3",6);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
            poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != paVar1) {
              operator_delete(local_208._M_dataplus._M_p,
                              CONCAT17(local_208.field_2._M_local_buf[7],
                                       CONCAT16(local_208.field_2._M_local_buf[6],
                                                CONCAT15(local_208.field_2._M_local_buf[5],
                                                         CONCAT14(local_208.field_2._M_local_buf[4],
                                                                  local_208.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                     local_230.field_2._M_local_buf[0]) + 1);
          }
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          local_230._M_string_length = 0;
          local_230.field_2._M_local_buf[0] = '\0';
          local_208.field_2._M_allocated_capacity._0_4_ = 0x6174656d;
          local_208.field_2._M_local_buf[4] = 'l';
          local_208.field_2._M_local_buf[5] = 'l';
          local_208.field_2._M_local_buf[6] = 'i';
          local_208.field_2._M_local_buf[7] = 'c';
          local_208._M_string_length = 8;
          local_208.field_2._M_local_buf[8] = '\0';
          local_208._M_dataplus._M_p = (pointer)paVar1;
          bVar2 = detail::SerializeAttribute<float>
                            (&local_208,&(pMVar3->super_UsdPreviewSurface).metallic,&local_230,
                             local_210);
          uVar6 = extraout_EDX_07;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != paVar1) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT17(local_208.field_2._M_local_buf[7],
                                     CONCAT16(local_208.field_2._M_local_buf[6],
                                              CONCAT15(local_208.field_2._M_local_buf[5],
                                                       CONCAT14(local_208.field_2._M_local_buf[4],
                                                                local_208.field_2.
                                                                _M_allocated_capacity._0_4_)))) + 1)
            ;
            uVar6 = extraout_EDX_08;
          }
          if (bVar2) {
            if (local_230._M_string_length != 0) {
              pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<input name=\"",0xd);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"metallic",8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"float",5);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != paVar1) {
                operator_delete(local_208._M_dataplus._M_p,
                                CONCAT17(local_208.field_2._M_local_buf[7],
                                         CONCAT16(local_208.field_2._M_local_buf[6],
                                                  CONCAT15(local_208.field_2._M_local_buf[5],
                                                           CONCAT14(local_208.field_2._M_local_buf
                                                                    [4],local_208.field_2.
                                                                        _M_allocated_capacity._0_4_)
                                                          ))) + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,
                              CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                       local_230.field_2._M_local_buf[0]) + 1);
            }
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            local_230._M_string_length = 0;
            local_230.field_2._M_local_buf[0] = '\0';
            local_208.field_2._M_allocated_capacity._0_4_ = 0x67756f72;
            local_208.field_2._M_local_buf[4] = 'h';
            local_208.field_2._M_local_buf[5] = 'n';
            local_208.field_2._M_local_buf[6] = 'e';
            local_208.field_2._M_local_buf[7] = 's';
            local_208.field_2._M_local_buf[8] = 's';
            local_208.field_2._M_local_buf[9] = '\0';
            local_208._M_string_length = 9;
            local_208._M_dataplus._M_p = (pointer)paVar1;
            bVar2 = detail::SerializeAttribute<float>
                              (&local_208,&(pMVar3->super_UsdPreviewSurface).roughness,&local_230,
                               local_210);
            uVar6 = extraout_EDX_09;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != paVar1) {
              operator_delete(local_208._M_dataplus._M_p,
                              CONCAT17(local_208.field_2._M_local_buf[7],
                                       CONCAT16(local_208.field_2._M_local_buf[6],
                                                CONCAT15(local_208.field_2._M_local_buf[5],
                                                         CONCAT14(local_208.field_2._M_local_buf[4],
                                                                  local_208.field_2.
                                                                  _M_allocated_capacity._0_4_)))) +
                              1);
              uVar6 = extraout_EDX_10;
            }
            if (bVar2) {
              if (local_230._M_string_length != 0) {
                pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
                poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length)
                ;
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<input name=\"",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"roughness",9);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"float",5);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
                poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != paVar1) {
                  operator_delete(local_208._M_dataplus._M_p,
                                  CONCAT17(local_208.field_2._M_local_buf[7],
                                           CONCAT16(local_208.field_2._M_local_buf[6],
                                                    CONCAT15(local_208.field_2._M_local_buf[5],
                                                             CONCAT14(local_208.field_2._M_local_buf
                                                                      [4],local_208.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_4_)))) + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                         local_230.field_2._M_local_buf[0]) + 1);
              }
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              local_230._M_string_length = 0;
              local_230.field_2._M_local_buf[0] = '\0';
              local_208.field_2._M_allocated_capacity._0_4_ = 0x61656c63;
              local_208.field_2._M_local_buf[4] = 'r';
              local_208.field_2._M_local_buf[5] = 'c';
              local_208.field_2._M_local_buf[6] = 'o';
              local_208.field_2._M_local_buf[7] = 'a';
              local_208.field_2._M_local_buf[8] = 't';
              local_208.field_2._M_local_buf[9] = '\0';
              local_208._M_string_length = 9;
              local_208._M_dataplus._M_p = (pointer)paVar1;
              bVar2 = detail::SerializeAttribute<float>
                                (&local_208,&(pMVar3->super_UsdPreviewSurface).clearcoat,&local_230,
                                 local_210);
              uVar6 = extraout_EDX_11;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != paVar1) {
                operator_delete(local_208._M_dataplus._M_p,
                                CONCAT17(local_208.field_2._M_local_buf[7],
                                         CONCAT16(local_208.field_2._M_local_buf[6],
                                                  CONCAT15(local_208.field_2._M_local_buf[5],
                                                           CONCAT14(local_208.field_2._M_local_buf
                                                                    [4],local_208.field_2.
                                                                        _M_allocated_capacity._0_4_)
                                                          ))) + 1);
                uVar6 = extraout_EDX_12;
              }
              if (bVar2) {
                if (local_230._M_string_length != 0) {
                  pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
                  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     (local_1a8,local_208._M_dataplus._M_p,
                                      local_208._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<input name=\"",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"clearcoat",9);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"float",5);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
                  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != paVar1) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    CONCAT17(local_208.field_2._M_local_buf[7],
                                             CONCAT16(local_208.field_2._M_local_buf[6],
                                                      CONCAT15(local_208.field_2._M_local_buf[5],
                                                               CONCAT14(local_208.field_2.
                                                                        _M_local_buf[4],
                                                                        local_208.field_2.
                                                                        _M_allocated_capacity._0_4_)
                                                              ))) + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_230._M_dataplus._M_p != &local_230.field_2) {
                  operator_delete(local_230._M_dataplus._M_p,
                                  CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                           local_230.field_2._M_local_buf[0]) + 1);
                }
                local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                local_230._M_string_length = 0;
                local_230.field_2._M_local_buf[0] = '\0';
                local_208._M_dataplus._M_p = (pointer)paVar1;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_208,"clearcoatRoughness","");
                bVar2 = detail::SerializeAttribute<float>
                                  (&local_208,&(pMVar3->super_UsdPreviewSurface).clearcoatRoughness,
                                   &local_230,local_210);
                uVar6 = extraout_EDX_13;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != paVar1) {
                  operator_delete(local_208._M_dataplus._M_p,
                                  CONCAT17(local_208.field_2._M_local_buf[7],
                                           CONCAT16(local_208.field_2._M_local_buf[6],
                                                    CONCAT15(local_208.field_2._M_local_buf[5],
                                                             CONCAT14(local_208.field_2._M_local_buf
                                                                      [4],local_208.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_4_)))) + 1);
                  uVar6 = extraout_EDX_14;
                }
                if (bVar2) {
                  if (local_230._M_string_length != 0) {
                    pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
                    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       (local_1a8,local_208._M_dataplus._M_p,
                                        local_208._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar4,"<input name=\"",0xd);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar4,"clearcoatRoughness",0x12);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"float",5);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
                    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar4,local_230._M_dataplus._M_p,local_230._M_string_length
                                       );
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208._M_dataplus._M_p != paVar1) {
                      operator_delete(local_208._M_dataplus._M_p,
                                      CONCAT17(local_208.field_2._M_local_buf[7],
                                               CONCAT16(local_208.field_2._M_local_buf[6],
                                                        CONCAT15(local_208.field_2._M_local_buf[5],
                                                                 CONCAT14(local_208.field_2.
                                                                          _M_local_buf[4],
                                                                          local_208.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_4_)))) + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != &local_230.field_2) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                             local_230.field_2._M_local_buf[0]) + 1);
                  }
                  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                  local_230._M_string_length = 0;
                  local_230.field_2._M_local_buf[0] = '\0';
                  local_208.field_2._M_allocated_capacity._0_4_ = 0x6361706f;
                  local_208.field_2._M_local_buf[4] = 'i';
                  local_208.field_2._M_local_buf[5] = 't';
                  local_208.field_2._M_local_buf[6] = 'y';
                  local_208._M_string_length = 7;
                  local_208.field_2._M_local_buf[7] = '\0';
                  local_208._M_dataplus._M_p = (pointer)paVar1;
                  bVar2 = detail::SerializeAttribute<float>
                                    (&local_208,&(pMVar3->super_UsdPreviewSurface).opacity,
                                     &local_230,local_210);
                  uVar6 = extraout_EDX_15;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != paVar1) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    CONCAT17(local_208.field_2._M_local_buf[7],
                                             CONCAT16(local_208.field_2._M_local_buf[6],
                                                      CONCAT15(local_208.field_2._M_local_buf[5],
                                                               CONCAT14(local_208.field_2.
                                                                        _M_local_buf[4],
                                                                        local_208.field_2.
                                                                        _M_allocated_capacity._0_4_)
                                                              ))) + 1);
                    uVar6 = extraout_EDX_16;
                  }
                  if (bVar2) {
                    if (local_230._M_string_length != 0) {
                      pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
                      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         (local_1a8,local_208._M_dataplus._M_p,
                                          local_208._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar4,"<input name=\"",0xd);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"opacity",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"float",5);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
                      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar4,local_230._M_dataplus._M_p,
                                          local_230._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_208._M_dataplus._M_p != paVar1) {
                        operator_delete(local_208._M_dataplus._M_p,
                                        CONCAT17(local_208.field_2._M_local_buf[7],
                                                 CONCAT16(local_208.field_2._M_local_buf[6],
                                                          CONCAT15(local_208.field_2._M_local_buf[5]
                                                                   ,CONCAT14(local_208.field_2.
                                                                             _M_local_buf[4],
                                                                             local_208.field_2.
                                                                             _M_allocated_capacity.
                                                                             _0_4_)))) + 1);
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_230._M_dataplus._M_p != &local_230.field_2) {
                      operator_delete(local_230._M_dataplus._M_p,
                                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                               local_230.field_2._M_local_buf[0]) + 1);
                    }
                    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                    local_230._M_string_length = 0;
                    local_230.field_2._M_local_buf[0] = '\0';
                    local_208._M_dataplus._M_p = (pointer)paVar1;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_208,"opacityThreshold","");
                    bVar2 = detail::SerializeAttribute<float>
                                      (&local_208,
                                       &(pMVar3->super_UsdPreviewSurface).opacityThreshold,
                                       &local_230,local_210);
                    uVar6 = extraout_EDX_17;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208._M_dataplus._M_p != paVar1) {
                      operator_delete(local_208._M_dataplus._M_p,
                                      CONCAT17(local_208.field_2._M_local_buf[7],
                                               CONCAT16(local_208.field_2._M_local_buf[6],
                                                        CONCAT15(local_208.field_2._M_local_buf[5],
                                                                 CONCAT14(local_208.field_2.
                                                                          _M_local_buf[4],
                                                                          local_208.field_2.
                                                                          _M_allocated_capacity.
                                                                          _0_4_)))) + 1);
                      uVar6 = extraout_EDX_18;
                    }
                    if (bVar2) {
                      if (local_230._M_string_length != 0) {
                        pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
                        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                           (local_1a8,local_208._M_dataplus._M_p,
                                            local_208._M_string_length);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar4,"<input name=\"",0xd);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar4,"opacityThreshold",0x10);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"",8);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"float",5);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9)
                        ;
                        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar4,local_230._M_dataplus._M_p,
                                            local_230._M_string_length);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_208._M_dataplus._M_p != paVar1) {
                          operator_delete(local_208._M_dataplus._M_p,
                                          CONCAT17(local_208.field_2._M_local_buf[7],
                                                   CONCAT16(local_208.field_2._M_local_buf[6],
                                                            CONCAT15(local_208.field_2._M_local_buf
                                                                     [5],CONCAT14(local_208.field_2.
                                                                                  _M_local_buf[4],
                                                                                  local_208.field_2.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_4_)))) + 1);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_230._M_dataplus._M_p != &local_230.field_2) {
                        operator_delete(local_230._M_dataplus._M_p,
                                        CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                                 local_230.field_2._M_local_buf[0]) + 1);
                      }
                      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                      local_230._M_string_length = 0;
                      local_230.field_2._M_local_buf[0] = '\0';
                      local_208.field_2._M_allocated_capacity._0_4_ = 0x726f69;
                      local_208._M_string_length = 3;
                      local_208._M_dataplus._M_p = (pointer)paVar1;
                      bVar2 = detail::SerializeAttribute<float>
                                        (&local_208,&(pMVar3->super_UsdPreviewSurface).ior,
                                         &local_230,local_210);
                      uVar6 = extraout_EDX_19;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_208._M_dataplus._M_p != paVar1) {
                        operator_delete(local_208._M_dataplus._M_p,
                                        CONCAT17(local_208.field_2._M_local_buf[7],
                                                 CONCAT16(local_208.field_2._M_local_buf[6],
                                                          CONCAT15(local_208.field_2._M_local_buf[5]
                                                                   ,CONCAT14(local_208.field_2.
                                                                             _M_local_buf[4],
                                                                             local_208.field_2.
                                                                             _M_allocated_capacity.
                                                                             _0_4_)))) + 1);
                        uVar6 = extraout_EDX_20;
                      }
                      if (bVar2) {
                        if (local_230._M_string_length != 0) {
                          pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
                          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                             (local_1a8,local_208._M_dataplus._M_p,
                                              local_208._M_string_length);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar4,"<input name=\"",0xd);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ior",3);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar4,"\" type=\"",8);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"float",5);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar4,"\" value=\"",9);
                          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar4,local_230._M_dataplus._M_p,
                                              local_230._M_string_length);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_208._M_dataplus._M_p != paVar1) {
                            operator_delete(local_208._M_dataplus._M_p,
                                            CONCAT17(local_208.field_2._M_local_buf[7],
                                                     CONCAT16(local_208.field_2._M_local_buf[6],
                                                              CONCAT15(local_208.field_2.
                                                                       _M_local_buf[5],
                                                                       CONCAT14(local_208.field_2.
                                                                                _M_local_buf[4],
                                                                                local_208.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_4_)))) + 1);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_230._M_dataplus._M_p != &local_230.field_2) {
                          operator_delete(local_230._M_dataplus._M_p,
                                          CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                                   local_230.field_2._M_local_buf[0]) + 1);
                        }
                        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                        local_230._M_string_length = 0;
                        local_230.field_2._M_local_buf[0] = '\0';
                        local_208.field_2._M_allocated_capacity._0_4_ = 0x6d726f6e;
                        local_208.field_2._M_local_buf[4] = 'a';
                        local_208.field_2._M_local_buf[5] = 'l';
                        local_208._M_string_length = 6;
                        local_208.field_2._M_local_buf[6] = '\0';
                        local_208._M_dataplus._M_p = (pointer)paVar1;
                        bVar2 = detail::SerializeAttribute<tinyusdz::value::normal3f>
                                          (&local_208,&(pMVar3->super_UsdPreviewSurface).normal,
                                           &local_230,local_210);
                        uVar6 = extraout_EDX_21;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_208._M_dataplus._M_p != paVar1) {
                          operator_delete(local_208._M_dataplus._M_p,
                                          CONCAT17(local_208.field_2._M_local_buf[7],
                                                   CONCAT16(local_208.field_2._M_local_buf[6],
                                                            CONCAT15(local_208.field_2._M_local_buf
                                                                     [5],CONCAT14(local_208.field_2.
                                                                                  _M_local_buf[4],
                                                                                  local_208.field_2.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_4_)))) + 1);
                          uVar6 = extraout_EDX_22;
                        }
                        if (bVar2) {
                          if (local_230._M_string_length != 0) {
                            pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
                            poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               (local_1a8,local_208._M_dataplus._M_p,
                                                local_208._M_string_length);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar4,"<input name=\"",0xd);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"normal",6);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar4,"\" type=\"",8);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vector3",7)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar4,"\" value=\"",9);
                            poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar4,local_230._M_dataplus._M_p,
                                                local_230._M_string_length);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" />\n",5)
                            ;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_208._M_dataplus._M_p != paVar1) {
                              operator_delete(local_208._M_dataplus._M_p,
                                              CONCAT17(local_208.field_2._M_local_buf[7],
                                                       CONCAT16(local_208.field_2._M_local_buf[6],
                                                                CONCAT15(local_208.field_2.
                                                                         _M_local_buf[5],
                                                                         CONCAT14(local_208.field_2.
                                                                                  _M_local_buf[4],
                                                                                  local_208.field_2.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_4_)))) + 1);
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_230._M_dataplus._M_p != &local_230.field_2) {
                            operator_delete(local_230._M_dataplus._M_p,
                                            CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                                     local_230.field_2._M_local_buf[0]) + 1);
                          }
                          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                          local_230._M_string_length = 0;
                          local_230.field_2._M_local_buf[0] = '\0';
                          local_208.field_2._M_allocated_capacity._0_4_ = 0x70736964;
                          local_208.field_2._M_local_buf[4] = 'l';
                          local_208.field_2._M_local_buf[5] = 'a';
                          local_208.field_2._M_local_buf[6] = 'c';
                          local_208.field_2._M_local_buf[7] = 'e';
                          local_208.field_2._M_local_buf[8] = 'm';
                          local_208.field_2._M_local_buf[9] = 'e';
                          local_208.field_2._10_2_ = 0x746e;
                          local_208._M_string_length = 0xc;
                          local_208.field_2._M_local_buf[0xc] = '\0';
                          local_208._M_dataplus._M_p = (pointer)paVar1;
                          bVar2 = detail::SerializeAttribute<float>
                                            (&local_208,
                                             &(pMVar3->super_UsdPreviewSurface).displacement,
                                             &local_230,local_210);
                          uVar6 = extraout_EDX_23;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_208._M_dataplus._M_p != paVar1) {
                            operator_delete(local_208._M_dataplus._M_p,
                                            CONCAT17(local_208.field_2._M_local_buf[7],
                                                     CONCAT16(local_208.field_2._M_local_buf[6],
                                                              CONCAT15(local_208.field_2.
                                                                       _M_local_buf[5],
                                                                       CONCAT14(local_208.field_2.
                                                                                _M_local_buf[4],
                                                                                local_208.field_2.
                                                                                                                                                                
                                                  _M_allocated_capacity._0_4_)))) + 1);
                            uVar6 = extraout_EDX_24;
                          }
                          if (bVar2) {
                            if (local_230._M_string_length != 0) {
                              pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
                              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 (local_1a8,local_208._M_dataplus._M_p,
                                                  local_208._M_string_length);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,"<input name=\"",0xd);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,"displacement",0xc);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,"\" type=\"",8);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"float",5)
                              ;
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,"\" value=\"",9);
                              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar4,local_230._M_dataplus._M_p,
                                                  local_230._M_string_length);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,"\" />\n",5);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_208._M_dataplus._M_p != paVar1) {
                                operator_delete(local_208._M_dataplus._M_p,
                                                CONCAT17(local_208.field_2._M_local_buf[7],
                                                         CONCAT16(local_208.field_2._M_local_buf[6],
                                                                  CONCAT15(local_208.field_2.
                                                                           _M_local_buf[5],
                                                                           CONCAT14(local_208.
                                                                                    field_2.
                                                  _M_local_buf[4],
                                                  local_208.field_2._M_allocated_capacity._0_4_))))
                                                + 1);
                              }
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
                              operator_delete(local_230._M_dataplus._M_p,
                                              CONCAT71(local_230.field_2._M_allocated_capacity._1_7_
                                                       ,local_230.field_2._M_local_buf[0]) + 1);
                            }
                            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                            local_230._M_string_length = 0;
                            local_230.field_2._M_local_buf[0] = '\0';
                            local_208.field_2._M_allocated_capacity._0_4_ = 0x6c63636f;
                            local_208.field_2._M_local_buf[4] = 'u';
                            local_208.field_2._M_local_buf[5] = 's';
                            local_208.field_2._M_local_buf[6] = 'i';
                            local_208.field_2._M_local_buf[7] = 'o';
                            local_208.field_2._M_local_buf[8] = 'n';
                            local_208.field_2._M_local_buf[9] = '\0';
                            local_208._M_string_length = 9;
                            local_208._M_dataplus._M_p = (pointer)paVar1;
                            bVar2 = detail::SerializeAttribute<float>
                                              (&local_208,
                                               &(pMVar3->super_UsdPreviewSurface).occlusion,
                                               &local_230,local_210);
                            uVar6 = extraout_EDX_25;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_208._M_dataplus._M_p != paVar1) {
                              operator_delete(local_208._M_dataplus._M_p,
                                              CONCAT17(local_208.field_2._M_local_buf[7],
                                                       CONCAT16(local_208.field_2._M_local_buf[6],
                                                                CONCAT15(local_208.field_2.
                                                                         _M_local_buf[5],
                                                                         CONCAT14(local_208.field_2.
                                                                                  _M_local_buf[4],
                                                                                  local_208.field_2.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_4_)))) + 1);
                              uVar6 = extraout_EDX_26;
                            }
                            if (bVar2) {
                              if (local_230._M_string_length != 0) {
                                pprint::Indent_abi_cxx11_(&local_208,(pprint *)0x2,uVar6);
                                poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                   (local_1a8,local_208._M_dataplus._M_p,
                                                    local_208._M_string_length);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar4,"<input name=\"",0xd);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar4,"occlusion",9);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar4,"\" type=\"",8);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar4,"float",5);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar4,"\" value=\"",9);
                                poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                   (poVar4,local_230._M_dataplus._M_p,
                                                    local_230._M_string_length);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar4,"\" />\n",5);
                                uVar6 = extraout_EDX_27;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_208._M_dataplus._M_p != paVar1) {
                                  operator_delete(local_208._M_dataplus._M_p,
                                                  CONCAT17(local_208.field_2._M_local_buf[7],
                                                           CONCAT16(local_208.field_2._M_local_buf
                                                                    [6],CONCAT15(local_208.field_2.
                                                                                 _M_local_buf[5],
                                                                                 CONCAT14(local_208.
                                                                                          field_2.
                                                  _M_local_buf[4],
                                                  local_208.field_2._M_allocated_capacity._0_4_))))
                                                  + 1);
                                  uVar6 = extraout_EDX_28;
                                }
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                                operator_delete(local_230._M_dataplus._M_p,
                                                CONCAT71(local_230.field_2._M_allocated_capacity.
                                                         _1_7_,local_230.field_2._M_local_buf[0]) +
                                                1);
                                uVar6 = extraout_EDX_29;
                              }
                              pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x1,uVar6);
                              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 (local_1a8,local_230._M_dataplus._M_p,
                                                  local_230._M_string_length);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,"</UsdPreviewSurface>\n",0x15);
                              uVar6 = extraout_EDX_30;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                                operator_delete(local_230._M_dataplus._M_p,
                                                CONCAT71(local_230.field_2._M_allocated_capacity.
                                                         _1_7_,local_230.field_2._M_local_buf[0]) +
                                                1);
                                uVar6 = extraout_EDX_31;
                              }
                              pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x1,uVar6);
                              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 (local_1a8,local_230._M_dataplus._M_p,
                                                  local_230._M_string_length);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,
                                         "<surfacematerial name=\"USD_Default\" type=\"material\">\n"
                                         ,0x35);
                              uVar6 = extraout_EDX_32;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                                operator_delete(local_230._M_dataplus._M_p,
                                                CONCAT71(local_230.field_2._M_allocated_capacity.
                                                         _1_7_,local_230.field_2._M_local_buf[0]) +
                                                1);
                                uVar6 = extraout_EDX_33;
                              }
                              pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x2,uVar6);
                              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 (local_1a8,local_230._M_dataplus._M_p,
                                                  local_230._M_string_length);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,
                                         "<input name=\"surfaceshader\" type=\"surfaceshader\" nodename=\""
                                         ,0x3b);
                              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar4,(char *)local_1e8,local_1e0);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,"\" />\n",5);
                              uVar6 = extraout_EDX_34;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                                operator_delete(local_230._M_dataplus._M_p,
                                                CONCAT71(local_230.field_2._M_allocated_capacity.
                                                         _1_7_,local_230.field_2._M_local_buf[0]) +
                                                1);
                                uVar6 = extraout_EDX_35;
                              }
                              pprint::Indent_abi_cxx11_(&local_230,(pprint *)0x1,uVar6);
                              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 (local_1a8,local_230._M_dataplus._M_p,
                                                  local_230._M_string_length);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar4,"</surfacematerial>\n",0x13);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                                operator_delete(local_230._M_dataplus._M_p,
                                                CONCAT71(local_230.field_2._M_allocated_capacity.
                                                         _1_7_,local_230.field_2._M_local_buf[0]) +
                                                1);
                              }
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,"</materialx>\n",0xd);
                              ::std::__cxx11::stringbuf::str();
                              ::std::__cxx11::string::operator=
                                        ((string *)local_1c8,(string *)&local_230);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                                operator_delete(local_230._M_dataplus._M_p,
                                                CONCAT71(local_230.field_2._M_allocated_capacity.
                                                         _1_7_,local_230.field_2._M_local_buf[0]) +
                                                1);
                              }
                              bVar2 = true;
                            }
                            else {
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                                operator_delete(local_230._M_dataplus._M_p,
                                                CONCAT71(local_230.field_2._M_allocated_capacity.
                                                         _1_7_,local_230.field_2._M_local_buf[0]) +
                                                1);
                              }
                              bVar2 = false;
                            }
                            goto LAB_002d3af6;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
  bVar2 = false;
LAB_002d3af6:
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar2;
}

Assistant:

bool WriteMaterialXToString(const MtlxModel &mtlx, std::string &xml_str,
                            std::string *warn, std::string *err) {
  if (auto usdps = mtlx.shader.as<MtlxUsdPreviewSurface>()) {
    return detail::WriteMaterialXToString(*usdps, xml_str, warn, err);
  } else if (auto adskss = mtlx.shader.as<MtlxAutodeskStandardSurface>()) {
    (void)adskss;
    // TODO
    PUSH_ERROR_AND_RETURN("TODO: AutodeskStandardSurface");
  } else {
    // TODO
    PUSH_ERROR_AND_RETURN("Unknown/unsupported shader: " << mtlx.shader_name);
  }

  return false;
}